

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

bool __thiscall
JsUtil::
BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
::Remove(BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
         *this,FunctionBody **key)

{
  int iVar1;
  int *piVar2;
  SimpleHashedEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
  *pSVar3;
  FunctionBody *pFVar4;
  SimpleHashedEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
  *pSVar5;
  uint uVar6;
  uint uVar7;
  ulong unaff_R12;
  uint unaff_R13D;
  uint depth;
  ulong uVar8;
  FunctionBody *local_48;
  FunctionBody **local_40;
  uint local_38;
  uint local_34;
  
  piVar2 = (this->buckets).ptr;
  depth = 0;
  if (piVar2 == (int *)0x0) {
    uVar7 = 0;
  }
  else {
    uVar6 = GetBucket((uint)((ulong)*key >> 3) | 1,this->bucketCount,this->modFunctionIndex);
    unaff_R12 = (ulong)uVar6;
    uVar7 = piVar2[uVar6];
    if (-1 < (long)(int)uVar7) {
      pSVar3 = (this->entries).ptr;
      pFVar4 = pSVar3[(int)uVar7].
               super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
               .
               super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
               .
               super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
               .super_ValueEntryData<Memory::WriteBarrierPtr<Js::FunctionBody>_>.value.ptr;
      local_38 = uVar6;
      Memory::Recycler::WBSetBit((char *)&local_48);
      local_48 = pFVar4;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_48);
      if (local_48 == *key) {
        uVar8 = 0;
        unaff_R13D = 0xffffffff;
      }
      else {
        uVar8 = 0;
        local_40 = key;
        do {
          unaff_R13D = uVar7;
          depth = (int)uVar8 + 1;
          uVar7 = pSVar3[unaff_R13D].
                  super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                  .
                  super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                  .
                  super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
                  .super_ValueEntryData<Memory::WriteBarrierPtr<Js::FunctionBody>_>.next;
          if ((long)(int)uVar7 < 0) {
            unaff_R12 = (ulong)local_38;
            goto LAB_00910a5a;
          }
          pFVar4 = pSVar3[(int)uVar7].
                   super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                   .
                   super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                   .
                   super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
                   .super_ValueEntryData<Memory::WriteBarrierPtr<Js::FunctionBody>_>.value.ptr;
          local_34 = depth;
          Memory::Recycler::WBSetBit((char *)&local_48);
          uVar8 = (ulong)local_34;
          local_48 = pFVar4;
          Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_48);
        } while (local_48 != *local_40);
      }
      unaff_R12 = (ulong)local_38;
      if (this->stats != (DictionaryStats *)0x0) {
        DictionaryStats::Lookup(this->stats,(uint)uVar8);
      }
      uVar8 = CONCAT71((int7)(uVar8 >> 8),1);
      goto LAB_00910a6e;
    }
    unaff_R13D = 0xffffffff;
  }
LAB_00910a5a:
  if (this->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this->stats,depth);
  }
  uVar8 = 0;
LAB_00910a6e:
  if ((char)uVar8 != '\0') {
    local_34 = (uint)uVar8;
    pSVar3 = (this->entries).ptr;
    iVar1 = pSVar3[(int)uVar7].
            super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
            .
            super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
            .
            super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
            .super_ValueEntryData<Memory::WriteBarrierPtr<Js::FunctionBody>_>.next;
    local_40 = (FunctionBody **)(unaff_R12 & 0xffffffff);
    if ((int)unaff_R13D < 0) {
      (this->buckets).ptr[(long)local_40] = iVar1;
    }
    else {
      pSVar3[unaff_R13D].
      super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
      .
      super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
      .
      super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
      .super_ValueEntryData<Memory::WriteBarrierPtr<Js::FunctionBody>_>.next = iVar1;
    }
    pSVar5 = (this->entries).ptr;
    pSVar3 = pSVar5 + (int)uVar7;
    Memory::Recycler::WBSetBit((char *)pSVar3);
    pSVar5[(int)uVar7].
    super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
    .
    super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
    .
    super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
    .super_ValueEntryData<Memory::WriteBarrierPtr<Js::FunctionBody>_>.value.ptr =
         (FunctionBody *)0x0;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pSVar3);
    SetNextFreeEntryIndex
              (this,(this->entries).ptr + (int)uVar7,-(uint)(this->freeCount == 0) | this->freeList)
    ;
    this->freeList = uVar7;
    this->freeCount = this->freeCount + 1;
    uVar8 = (ulong)local_34;
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Remove(this->stats,(this->buckets).ptr[(long)local_40] == -1);
    }
  }
  return SUB81(uVar8,0);
}

Assistant:

bool Remove(const TKey& key)
        {
            int i, last;
            uint targetBucket;
            if(FindEntryWithKey(key, &i, &last, &targetBucket))
            {
                RemoveAt(i, last, targetBucket);
                return true;
            }
            return false;
        }